

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd43_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  Mat *in_RSI;
  undefined8 *in_RDI;
  Mat top_blob_bordered;
  Mat top_blob_tm;
  int tiles;
  int h_tiles;
  int w_tiles;
  Mat bottom_blob_tm;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int inch;
  int h;
  int w;
  Option *in_stack_000006c0;
  Mat *in_stack_000006c8;
  Mat *in_stack_000006d0;
  Mat *in_stack_000006d8;
  Option *in_stack_00000b30;
  Mat *in_stack_00000b38;
  Mat *in_stack_00000b40;
  Option *in_stack_000018f0;
  Mat *in_stack_000018f8;
  Mat *in_stack_00001900;
  int in_stack_0000190c;
  Mat *in_stack_00001910;
  int in_stack_fffffffffffffba4;
  size_t in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  int _c;
  void **ppvVar5;
  undefined8 in_stack_fffffffffffffbb8;
  Allocator *pAVar6;
  Mat *in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  Mat *pMVar7;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbf0;
  Option *in_stack_fffffffffffffbf8;
  Mat local_3c8;
  void *local_380;
  int *local_378;
  undefined8 local_370;
  undefined4 local_368;
  long *local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined8 local_340;
  void *local_338;
  int *local_330;
  undefined8 local_328;
  undefined4 local_320;
  long *local_318;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined8 local_2f8;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Allocator local_2e0;
  int *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  void *local_288;
  int *local_280;
  void *local_278;
  undefined4 local_270;
  long *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  void *local_248;
  int local_240;
  uint local_23c;
  uint local_238;
  undefined4 local_234;
  undefined8 local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  Mat *local_200;
  Allocator *local_1f0;
  void **local_1e8;
  void **local_1e0;
  Mat *local_1d8;
  void **local_1d0;
  Mat *local_1c0;
  void **local_1b0;
  Allocator *local_1a0;
  void **local_190;
  int local_180;
  undefined4 local_17c;
  Mat *local_170;
  Mat *local_168;
  void **local_158;
  void **local_150;
  void **local_148;
  int local_140;
  undefined4 local_13c;
  void **local_138;
  Mat *local_128;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  int local_f0;
  undefined4 local_ec;
  Allocator *local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  Mat *local_a8;
  int local_90;
  undefined4 local_8c;
  void **local_88;
  void **local_78;
  void *local_70;
  void *local_60;
  void *local_50;
  _func_int **local_40;
  void *local_30;
  void *local_18;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  local_224 = *(undefined4 *)(in_RDI + 7);
  local_230 = in_RDI[2];
  local_234 = *(undefined4 *)(in_RDI + 3);
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_240 = in_RSI->c;
  local_78 = &local_288;
  local_288 = (void *)*in_RDI;
  local_280 = (int *)in_RDI[1];
  local_278 = (void *)in_RDI[2];
  local_270 = *(undefined4 *)(in_RDI + 3);
  local_268 = (long *)in_RDI[4];
  local_260 = *(undefined4 *)(in_RDI + 5);
  local_25c = *(undefined4 *)((long)in_RDI + 0x2c);
  local_258 = *(undefined4 *)(in_RDI + 6);
  local_254 = *(undefined4 *)((long)in_RDI + 0x34);
  local_250 = *(undefined4 *)(in_RDI + 7);
  local_248 = (void *)in_RDI[8];
  if (local_280 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_280;
    *local_280 = *local_280 + 1;
    UNLOCK();
  }
  local_238 = iVar1 + 3;
  if ((int)local_238 < 0) {
    local_238 = iVar1 + 6;
  }
  local_238 = local_238 & 0xfffffffc;
  local_23c = iVar2 + 3;
  if ((int)local_23c < 0) {
    local_23c = iVar2 + 6;
  }
  local_23c = local_23c & 0xfffffffc;
  local_21c = local_238 + 2;
  local_220 = local_23c + 2;
  local_200 = in_RSI;
  local_8 = local_78;
  copy_make_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                   in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (int)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbf0,
                   (float)((ulong)in_stack_fffffffffffffbc0 >> 0x20),in_stack_fffffffffffffbf8);
  pAVar6 = &local_2e0;
  local_2e0._vptr_Allocator = (_func_int **)0x0;
  local_2d8 = (int *)0x0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = (long *)0x0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2ac = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  uVar4 = local_238;
  if ((int)local_238 < 0) {
    uVar4 = local_238 + 3;
  }
  local_2e4 = (int)uVar4 >> 2;
  uVar4 = local_23c;
  if ((int)local_23c < 0) {
    uVar4 = local_23c + 3;
  }
  local_2e8 = (int)uVar4 >> 2;
  local_2ec = local_2e4 * local_2e8;
  local_1f0 = pAVar6;
  Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
              (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
              pAVar6);
  conv3x3s1_winograd43_transform_input_pack8_avx
            (in_stack_00000b40,in_stack_00000b38,in_stack_00000b30);
  local_1e8 = &local_338;
  local_338 = (void *)0x0;
  local_330 = (int *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_318 = (long *)0x0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_158 = &local_338;
  local_150 = &local_288;
  if (&local_288 != local_158) {
    local_138 = &local_288;
    if (local_280 != (int *)0x0) {
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *local_280;
      *local_280 = *local_280 + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (local_268 == (long *)0x0) {
          local_18 = local_288;
          if (local_288 != (void *)0x0) {
            free(local_288);
          }
        }
        else {
          (**(code **)(*local_268 + 0x18))(local_268,local_288);
        }
      }
    }
    local_288 = (void *)0x0;
    local_278 = (void *)0x0;
    local_270 = 0;
    local_260 = 0;
    local_25c = 0;
    local_258 = 0;
    local_254 = 0;
    local_250 = 0;
    local_248 = (void *)0x0;
    local_280 = (int *)0x0;
    local_288 = *local_158;
    local_280 = (int *)local_158[1];
    local_278 = local_158[2];
    local_270 = *(undefined4 *)(local_158 + 3);
    local_268 = (long *)local_158[4];
    local_260 = *(undefined4 *)(local_158 + 5);
    local_25c = *(undefined4 *)((long)local_158 + 0x2c);
    local_258 = *(undefined4 *)(local_158 + 6);
    local_254 = *(undefined4 *)((long)local_158 + 0x34);
    local_250 = *(undefined4 *)(local_158 + 7);
    local_248 = local_158[8];
  }
  local_1d0 = &local_338;
  local_148 = &local_288;
  local_88 = local_1d0;
  if (local_330 != (int *)0x0) {
    local_8c = 0xffffffff;
    LOCK();
    local_90 = *local_330;
    *local_330 = *local_330 + -1;
    UNLOCK();
    if (local_90 == 1) {
      if (local_318 == (long *)0x0) {
        local_70 = local_338;
        if (local_338 != (void *)0x0) {
          free(local_338);
        }
      }
      else {
        (**(code **)(*local_318 + 0x18))(local_318,local_338);
      }
    }
  }
  local_338 = (void *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_330 = (int *)0x0;
  local_1e0 = &local_380;
  local_380 = (void *)0x0;
  local_378 = (int *)0x0;
  local_370 = 0;
  local_368 = 0;
  local_360 = (long *)0x0;
  local_358 = 0;
  local_354 = 0;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_340 = 0;
  convolution_winograd_dot_pack8_avx
            (in_stack_00001910,in_stack_0000190c,in_stack_00001900,in_stack_000018f8,
             in_stack_000018f0);
  pMVar7 = &local_3c8;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount = (int *)0x0;
  local_3c8.elemsize = 0;
  local_3c8.elempack = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_3c8.cstep = 0;
  local_1d8 = pMVar7;
  if ((local_238 == local_200->w) && (local_23c == local_200->h)) {
    local_170 = &local_3c8;
    local_168 = local_170;
    if (local_170 != local_200) {
      if (local_200->refcount != (int *)0x0) {
        piVar3 = local_200->refcount;
        local_17c = 1;
        LOCK();
        local_180 = *piVar3;
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_3c8.data = local_200->data;
      local_3c8.refcount = local_200->refcount;
      local_3c8.elemsize = local_200->elemsize;
      local_3c8.elempack = local_200->elempack;
      local_3c8.allocator = local_200->allocator;
      local_3c8.dims = local_200->dims;
      local_3c8.w = local_200->w;
      local_3c8.h = local_200->h;
      local_3c8.d = local_200->d;
      local_3c8.c = local_200->c;
      local_3c8.cstep = local_200->cstep;
      in_stack_fffffffffffffbe0 = local_170;
      local_128 = local_170;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,
                in_stack_fffffffffffffba4,pAVar6);
  }
  conv3x3s1_winograd43_transform_output_pack8_avx
            (in_stack_000006d8,in_stack_000006d0,in_stack_000006c8,in_stack_000006c0);
  copy_cut_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                  in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                  (int)in_stack_fffffffffffffbc8,(Option *)pMVar7);
  pMVar7 = &local_3c8;
  local_1c0 = pMVar7;
  local_a8 = pMVar7;
  if (local_3c8.refcount != (int *)0x0) {
    local_ac = 0xffffffff;
    LOCK();
    local_b0 = *local_3c8.refcount;
    *local_3c8.refcount = *local_3c8.refcount + -1;
    UNLOCK();
    if (local_b0 == 1) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        local_60 = local_3c8.data;
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])(local_3c8.allocator,local_3c8.data);
      }
    }
  }
  pMVar7->data = (void *)0x0;
  pMVar7->elemsize = 0;
  pMVar7->elempack = 0;
  pMVar7->dims = 0;
  pMVar7->w = 0;
  pMVar7->h = 0;
  pMVar7->d = 0;
  pMVar7->c = 0;
  pMVar7->cstep = 0;
  pMVar7->refcount = (int *)0x0;
  ppvVar5 = &local_380;
  local_1b0 = ppvVar5;
  local_c8 = ppvVar5;
  if (local_378 != (int *)0x0) {
    local_cc = 0xffffffff;
    LOCK();
    local_d0 = *local_378;
    *local_378 = *local_378 + -1;
    UNLOCK();
    if (local_d0 == 1) {
      if (local_360 == (long *)0x0) {
        local_50 = local_380;
        if (local_380 != (void *)0x0) {
          free(local_380);
        }
      }
      else {
        (**(code **)(*local_360 + 0x18))(local_360,local_380);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  pAVar6 = &local_2e0;
  local_1a0 = pAVar6;
  local_e8 = pAVar6;
  if (local_2d8 != (int *)0x0) {
    local_ec = 0xffffffff;
    LOCK();
    local_f0 = *local_2d8;
    *local_2d8 = *local_2d8 + -1;
    UNLOCK();
    if (local_f0 == 1) {
      if (local_2c0 == (long *)0x0) {
        local_40 = local_2e0._vptr_Allocator;
        if (local_2e0._vptr_Allocator != (_func_int **)0x0) {
          free(local_2e0._vptr_Allocator);
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0._vptr_Allocator);
      }
    }
  }
  pAVar6->_vptr_Allocator = (_func_int **)0x0;
  pAVar6[2]._vptr_Allocator = (_func_int **)0x0;
  *(undefined4 *)&pAVar6[3]._vptr_Allocator = 0;
  *(undefined4 *)&pAVar6[5]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar6[5]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar6[6]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar6[6]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar6[7]._vptr_Allocator = 0;
  pAVar6[8]._vptr_Allocator = (_func_int **)0x0;
  pAVar6[1]._vptr_Allocator = (_func_int **)0x0;
  ppvVar5 = &local_288;
  if (local_280 != (int *)0x0) {
    local_10c = 0xffffffff;
    LOCK();
    local_110 = *local_280;
    *local_280 = *local_280 + -1;
    UNLOCK();
    if (local_110 == 1) {
      local_190 = ppvVar5;
      local_108 = ppvVar5;
      if (local_268 == (long *)0x0) {
        local_30 = local_288;
        if (local_288 != (void *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)(*local_268 + 0x18))(local_268,local_288);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd43_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 4n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 3) / 4 * 4;
    outh = (outh + 3) / 4 * 4;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 4;
        int h_tiles = outh / 4;
        const int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 36, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd43_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd43_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}